

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::tree_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::tree_node<char,_false>_>::operator=
          (ref<immutable::rrb_details::tree_node<char,_false>_> *this,
          ref<immutable::rrb_details::tree_node<char,_false>_> *r)

{
  tree_node<char,_false> *ptVar1;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_10;
  
  ptVar1 = r->ptr;
  if (ptVar1 != (tree_node<char,_false> *)0x0) {
    ptVar1->_ref_count = ptVar1->_ref_count + 1;
  }
  local_10 = (ref<immutable::rrb_details::tree_node<char,_false>_>)this->ptr;
  this->ptr = ptVar1;
  ~ref(&local_10);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }